

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

char * icetSingleImageStrategyNameFromEnum(IceTEnum strategy)

{
  char *pcStack_10;
  IceTEnum strategy_local;
  
  switch(strategy) {
  case 0x7001:
    pcStack_10 = "Automatic";
    break;
  case 0x7002:
    pcStack_10 = "Binary Swap";
    break;
  case 0x7003:
    pcStack_10 = "Binary Tree";
    break;
  case 0x7004:
    pcStack_10 = "Radix-k";
    break;
  default:
    icetRaiseDiagnostic("Invalid single image strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x95);
    pcStack_10 = "<Invalid>";
  }
  return pcStack_10;
}

Assistant:

const char *icetSingleImageStrategyNameFromEnum(IceTEnum strategy)
{
    switch(strategy) {
      case ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC:        return "Automatic";
      case ICET_SINGLE_IMAGE_STRATEGY_BSWAP:            return "Binary Swap";
      case ICET_SINGLE_IMAGE_STRATEGY_TREE:             return "Binary Tree";
      case ICET_SINGLE_IMAGE_STRATEGY_RADIXK:           return "Radix-k";
      default:
          icetRaiseError("Invalid single image strategy.", ICET_INVALID_ENUM);
          return "<Invalid>";
    }
}